

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int ncnn::set_cpu_powersave(int powersave)

{
  int iVar1;
  int iVar2;
  CpuSet *thread_affinity_mask;
  
  try_initialize_global_cpu_info();
  if ((uint)powersave < 3) {
    thread_affinity_mask = get_cpu_thread_affinity_mask(powersave);
    iVar1 = set_cpu_thread_affinity(thread_affinity_mask);
    iVar2 = -1;
    if (iVar1 == 0) {
      iVar2 = 0;
      g_powersave = powersave;
    }
  }
  else {
    set_cpu_powersave((ncnn *)(ulong)(uint)powersave);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int set_cpu_powersave(int powersave)
{
    try_initialize_global_cpu_info();
    if (powersave < 0 || powersave > 2)
    {
        NCNN_LOGE("powersave %d not supported", powersave);
        return -1;
    }

    const CpuSet& thread_affinity_mask = get_cpu_thread_affinity_mask(powersave);

    int ret = set_cpu_thread_affinity(thread_affinity_mask);
    if (ret != 0)
        return ret;

    g_powersave = powersave;

    return 0;
}